

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O2

void __thiscall
glslang::TReflectionTraverser::addPipeIOVariable(TReflectionTraverser *this,TIntermSymbol *base)

{
  EShLanguageMask *pEVar1;
  uint uVar2;
  TReflection *pTVar3;
  TString *pTVar4;
  bool bVar5;
  int iVar6;
  int pSize;
  iterator iVar7;
  undefined4 extraout_var;
  TType *type;
  undefined4 extraout_var_01;
  iterator iVar8;
  undefined4 extraout_var_02;
  mapped_type *pmVar9;
  bool input;
  long lVar10;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this_00;
  long lVar11;
  vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_> *this_01;
  allocator<char> local_101;
  long local_100;
  TString *local_f8;
  TString baseName;
  undefined1 local_c8 [16];
  undefined1 local_b8 [136];
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *name;
  undefined4 extraout_var_00;
  
  local_c8._0_8_ = base;
  iVar7 = std::
          _Rb_tree<const_TIntermNode_*,_const_TIntermNode_*,_std::_Identity<const_TIntermNode_*>,_std::less<const_TIntermNode_*>,_std::allocator<const_TIntermNode_*>_>
          ::find(&(this->processedDerefs)._M_t,(key_type *)local_c8);
  if ((_Rb_tree_header *)iVar7._M_node !=
      &(this->processedDerefs)._M_t._M_impl.super__Rb_tree_header) {
    return;
  }
  local_c8._0_8_ = base;
  std::
  _Rb_tree<TIntermNode_const*,TIntermNode_const*,std::_Identity<TIntermNode_const*>,std::less<TIntermNode_const*>,std::allocator<TIntermNode_const*>>
  ::_M_insert_unique<TIntermNode_const*>
            ((_Rb_tree<TIntermNode_const*,TIntermNode_const*,std::_Identity<TIntermNode_const*>,std::less<TIntermNode_const*>,std::allocator<TIntermNode_const*>>
              *)&this->processedDerefs,(TIntermNode **)local_c8);
  iVar6 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(base);
  name = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
         CONCAT44(extraout_var,iVar6);
  iVar6 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(base);
  type = (TType *)CONCAT44(extraout_var_00,iVar6);
  iVar6 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(base);
  uVar2 = *(uint *)(CONCAT44(extraout_var_01,iVar6) + 8);
  lVar10 = 200;
  lVar11 = 0x170;
  input = false;
  if (((uVar2 & 0x7f) < 0x1c) && (input = false, (0xe300008U >> (uVar2 & 0x1f) & 1) != 0)) {
    input = true;
    lVar10 = 0x98;
    lVar11 = 0x158;
  }
  pTVar3 = this->reflection;
  if ((pTVar3->options & EShReflectionUnwrapIOBlocks) == EShReflectionDefault) {
    this_01 = (vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_> *)
              ((long)&pTVar3->_vptr_TReflection + lVar11);
    this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)((long)&pTVar3->_vptr_TReflection + lVar10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_c8,(name->_M_dataplus)._M_p,(allocator<char> *)&baseName);
    iVar8 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::find(this_00,(key_type *)local_c8);
    local_f8 = name;
    std::__cxx11::string::_M_dispose();
    pTVar4 = local_f8;
    if ((_Rb_tree_header *)iVar8._M_node != &(this_00->_M_impl).super__Rb_tree_header) {
      pEVar1 = &(this_01->
                super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
                )._M_impl.super__Vector_impl_data._M_start[(int)iVar8._M_node[2]._M_color].stages;
      *pEVar1 = *pEVar1 | 1 << ((char)this->intermediate->language & 0x1f);
      return;
    }
    local_100 = ((long)(this_01->
                       super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                (long)(this_01->
                      super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
                      )._M_impl.super__Vector_impl_data._M_start) / 0x50;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_c8,(local_f8->_M_dataplus)._M_p,(allocator<char> *)&baseName);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           *)this_00,(key_type *)local_c8);
    *pmVar9 = (mapped_type)local_100;
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&baseName,(pTVar4->_M_dataplus)._M_p,&local_101);
    iVar6 = mapToGlType(this,type);
    pSize = mapToGlArraySize(this,type);
    TObjectReflection::TObjectReflection
              ((TObjectReflection *)local_c8,(string *)&baseName,type,0,iVar6,pSize,0);
    std::vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>::
    emplace_back<glslang::TObjectReflection>(this_01,(TObjectReflection *)local_c8);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    pEVar1 = &(this_01->
              super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
              )._M_impl.super__Vector_impl_data._M_finish[-1].stages;
    *pEVar1 = *pEVar1 | 1 << ((char)this->intermediate->language & 0x1f);
    return;
  }
  bVar5 = IsAnonymous(name);
  baseName._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
  baseName._M_string_length = 0;
  baseName.field_2._M_local_buf[0] = '\0';
  baseName._M_dataplus._M_p = (pointer)&baseName.field_2;
  iVar6 = (*type->_vptr_TType[7])(type);
  if (iVar6 == 0x10) {
    if (bVar5) {
LAB_003093d0:
      local_c8._0_8_ = GetThreadPoolAllocator();
      local_b8._0_8_ = 0;
      local_b8[8] = '\0';
      local_c8._8_8_ = local_b8 + 8;
      goto LAB_003094c4;
    }
    iVar6 = (*type->_vptr_TType[5])(type);
    name = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
           CONCAT44(extraout_var_02,iVar6);
  }
  else if (bVar5) goto LAB_003093d0;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               local_c8,name);
LAB_003094c4:
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  _M_assign(&baseName,
            (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)local_c8);
  iVar6 = (*type->_vptr_TType[0x1d])(type);
  if (((char)iVar6 != '\0') && (iVar6 = (*type->_vptr_TType[7])(type), iVar6 == 0x10)) {
    TType::TType((TType *)local_c8,type,0,false);
    type = (TType *)local_c8;
  }
  blowUpIOAggregate(this,input,&baseName,type);
  return;
}

Assistant:

void addPipeIOVariable(const TIntermSymbol& base)
    {
        if (processedDerefs.find(&base) == processedDerefs.end()) {
            processedDerefs.insert(&base);

            const TString &name = base.getName();
            const TType &type = base.getType();
            const bool input = base.getQualifier().isPipeInput();

            TReflection::TMapIndexToReflection &ioItems =
                input ? reflection.indexToPipeInput : reflection.indexToPipeOutput;


            TReflection::TNameToIndex &ioMapper =
                input ? reflection.pipeInNameToIndex : reflection.pipeOutNameToIndex;

            if (reflection.options & EShReflectionUnwrapIOBlocks) {
                bool anonymous = IsAnonymous(name);

                TString baseName;
                if (type.getBasicType() == EbtBlock) {
                    baseName = anonymous ? TString() : type.getTypeName();
                } else {
                    baseName = anonymous ? TString() : name;
                }

                // by convention if this is an arrayed block we ignore the array in the reflection
                if (type.isArray() && type.getBasicType() == EbtBlock) {
                    blowUpIOAggregate(input, baseName, TType(type, 0));
                } else {               
                    blowUpIOAggregate(input, baseName, type);
                }
            } else {
                TReflection::TNameToIndex::const_iterator it = ioMapper.find(name.c_str());
                if (it == ioMapper.end()) {
                    // seperate pipe i/o params from uniforms and blocks
                    // in is only for input in first stage as out is only for last stage. check traverse in call stack.
                    ioMapper[name.c_str()] = static_cast<int>(ioItems.size());
                    ioItems.push_back(
                        TObjectReflection(name.c_str(), type, 0, mapToGlType(type), mapToGlArraySize(type), 0));
                    EShLanguageMask& stages = ioItems.back().stages;
                    stages = static_cast<EShLanguageMask>(stages | 1 << intermediate.getStage());
                } else {
                    EShLanguageMask& stages = ioItems[it->second].stages;
                    stages = static_cast<EShLanguageMask>(stages | 1 << intermediate.getStage());
                }
            }
        }
    }